

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ComponentPtr __thiscall
libcellml::Parser::ParserImpl::loadComponentRef
          (ParserImpl *this,ModelPtr *model,XmlNodePtr *node,NameList *usedNames)

{
  ulong uVar1;
  _func_int **pp_Var2;
  IssueImpl *pIVar3;
  _Alloc_hider _Var4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  bool bVar5;
  Component *__tmp;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  long *plVar7;
  undefined8 *puVar8;
  ParserImpl *pPVar9;
  element_type *peVar10;
  ulong *puVar11;
  element_type *peVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_type *psVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  NameList *pNVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  undefined8 uVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  _func_int **pp_Var20;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  XmlAttributePtr XVar21;
  XmlNodePtr XVar22;
  ComponentPtr CVar23;
  string textNode;
  IssuePtr issue_3;
  string childEncapsulationId;
  IssuePtr issue;
  string parentComponentName;
  IssuePtr issue_4;
  IssuePtr issue_2;
  XmlAttributePtr attribute;
  string encapsulationId;
  string local_1b8;
  undefined1 local_198 [24];
  pointer puStack_180;
  IssuePtr local_178;
  element_type local_168;
  string local_158;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  IssuePtr local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  undefined4 local_5c;
  ParserImpl *local_58;
  NameList *local_50;
  ComponentPtr local_48;
  
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_58 = this;
  local_50 = usedNames;
  XVar21 = XmlNode::firstAttribute((XmlNode *)&local_98._M_allocated_capacity);
  pPVar9 = (ParserImpl *)
           XVar21.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68 = in_R8;
    do {
      bVar5 = XmlAttribute::isType((XmlAttribute *)local_98._M_allocated_capacity,"component","");
      p_Var17 = p_Var19;
      if (bVar5) {
        XmlAttribute::value_abi_cxx11_(&local_158,(XmlAttribute *)local_98._M_allocated_capacity);
        std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        this_00 = local_68;
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (*(undefined8 *)local_68,*(undefined8 *)(local_68 + 8),&local_f8);
        if (_Var6._M_current ==
            *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this_00 + 8)) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>(this_00,&local_f8);
        }
        else {
          Issue::IssueImpl::create();
          pIVar3 = *(IssueImpl **)(local_138._M_dataplus._M_p + 8);
          NamedEntity::name_abi_cxx11_
                    (&local_118,
                     (NamedEntity *)
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x2a64db);
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_168;
          peVar10 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar10) {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_168.mPimpl = (IssueImpl *)plVar7[3];
          }
          else {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
          }
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)peVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          puVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_1b8.field_2._M_allocated_capacity = *puVar11;
            local_1b8.field_2._8_8_ = puVar8[3];
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *puVar11;
            local_1b8._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_1b8._M_string_length = puVar8[1];
          *puVar8 = puVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1b8,(ulong)local_f8._M_dataplus._M_p);
          local_198._0_8_ = local_198 + 0x10;
          peVar12 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar12) {
            local_198._16_8_ =
                 (peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                 super_Entity._vptr_Entity;
            puStack_180 = (pointer)plVar7[3];
          }
          else {
            local_198._16_8_ =
                 (peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                 super_Entity._vptr_Entity;
            local_198._0_8_ = (element_type *)*plVar7;
          }
          local_198._8_8_ = plVar7[1];
          *plVar7 = (long)peVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append(local_198);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar13) {
            local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_158.field_2._8_8_ = plVar7[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_158._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158._M_string_length = plVar7[1];
          *plVar7 = (long)paVar13;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar3,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,
                            (ulong)((long)(xmlNodePtr *)local_198._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_168) {
            operator_delete(local_178.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_168._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_138._M_dataplus._M_p + 8) + 0x28),
                     (ModelPtr *)node);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_138._M_dataplus._M_p + 8),
                     COMPONENT_REF_COMPONENT_ATTRIBUTE_UNIQUE);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)&local_138);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
          }
        }
        bVar5 = ComponentEntity::containsComponent
                          ((ComponentEntity *)
                           (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,&local_f8,true);
        if (!bVar5) {
          Issue::IssueImpl::create();
          pIVar3 = *(IssueImpl **)(local_138._M_dataplus._M_p + 8);
          NamedEntity::name_abi_cxx11_
                    (&local_118,
                     (NamedEntity *)
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x2a64db);
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_168;
          peVar10 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar10) {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_168.mPimpl = (IssueImpl *)plVar7[3];
          }
          else {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
          }
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)peVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          puVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_1b8.field_2._M_allocated_capacity = *puVar11;
            local_1b8.field_2._8_8_ = puVar8[3];
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *puVar11;
            local_1b8._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_1b8._M_string_length = puVar8[1];
          *puVar8 = puVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1b8,(ulong)local_f8._M_dataplus._M_p);
          local_198._0_8_ = local_198 + 0x10;
          peVar12 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar12) {
            local_198._16_8_ =
                 (peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                 super_Entity._vptr_Entity;
            puStack_180 = (pointer)plVar7[3];
          }
          else {
            local_198._16_8_ =
                 (peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                 super_Entity._vptr_Entity;
            local_198._0_8_ = (element_type *)*plVar7;
          }
          local_198._8_8_ = plVar7[1];
          *plVar7 = (long)peVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append(local_198);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar13) {
            local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_158.field_2._8_8_ = plVar7[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_158._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158._M_string_length = plVar7[1];
          *plVar7 = (long)paVar13;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar3,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,
                            (ulong)((long)(xmlNodePtr *)local_198._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_168) {
            operator_delete(local_178.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_168._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_138._M_dataplus._M_p + 8) + 0x28),
                     (ModelPtr *)node);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_138._M_dataplus._M_p + 8),
                     COMPONENT_REF_COMPONENT_ATTRIBUTE_REFERENCE);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)&local_138);
          p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length;
          goto LAB_00243b87;
        }
        ComponentEntity::takeComponent
                  ((ComponentEntity *)&local_158,
                   (string *)
                   (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   ,SUB81(&local_f8,0));
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length;
        _Var4._M_p = local_158._M_dataplus._M_p;
        local_158._M_dataplus._M_p = (pointer)0x0;
        local_158._M_string_length = 0;
        (local_58->super_LoggerImpl).mErrors.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)_Var4._M_p;
        (local_58->super_LoggerImpl).mErrors.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)p_Var17;
        if ((p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
        }
      }
      else {
        bVar5 = isIdAttribute((XmlAttributePtr *)&local_98,
                              *(bool *)&model[6].
                                        super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
        if (bVar5) {
          XmlAttribute::value_abi_cxx11_(&local_158,(XmlAttribute *)local_98._M_allocated_capacity);
          std::__cxx11::string::operator=((string *)&local_88,(string *)&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00243b94;
        }
        Issue::IssueImpl::create();
        pIVar3 = *(IssueImpl **)(local_b8._0_8_ + 8);
        NamedEntity::name_abi_cxx11_
                  (&local_118,
                   (NamedEntity *)
                   (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  );
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x2a64db);
        local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &local_168;
        peVar10 = (element_type *)(plVar7 + 2);
        if ((element_type *)*plVar7 == peVar10) {
          local_168._vptr_Issue = peVar10->_vptr_Issue;
          local_168.mPimpl = (IssueImpl *)plVar7[3];
        }
        else {
          local_168._vptr_Issue = peVar10->_vptr_Issue;
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar7;
        }
        local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
        *plVar7 = (long)peVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_1b8.field_2._M_allocated_capacity = *puVar11;
          local_1b8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_1b8.field_2._M_allocated_capacity = *puVar11;
          local_1b8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_1b8._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        XmlAttribute::name_abi_cxx11_(&local_138,(XmlAttribute *)local_98._M_allocated_capacity);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          uVar18 = local_1b8.field_2._M_allocated_capacity;
        }
        uVar1 = (long)(_func_int ***)local_138._M_string_length + local_1b8._M_string_length;
        if ((ulong)uVar18 < uVar1) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            uVar18 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < uVar1) goto LAB_002437a8;
          plVar7 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_138,0,(char *)0x0,
                                      (ulong)local_1b8._M_dataplus._M_p);
        }
        else {
LAB_002437a8:
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1b8,(ulong)local_138._M_dataplus._M_p);
        }
        local_198._0_8_ = local_198 + 0x10;
        peVar12 = (element_type *)(plVar7 + 2);
        if ((element_type *)*plVar7 == peVar12) {
          local_198._16_8_ =
               (peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          puStack_180 = (pointer)plVar7[3];
        }
        else {
          local_198._16_8_ =
               (peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          local_198._0_8_ = (element_type *)*plVar7;
        }
        local_198._8_8_ = plVar7[1];
        *plVar7 = (long)peVar12;
        plVar7[1] = 0;
        *(undefined1 *)
         &(peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
          _vptr_Entity = 0;
        plVar7 = (long *)std::__cxx11::string::append(local_198);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 == paVar13) {
          local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_158.field_2._8_8_ = plVar7[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_158._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_158._M_string_length = plVar7[1];
        *plVar7 = (long)paVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        Issue::IssueImpl::setDescription(pIVar3,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
          operator_delete((void *)local_198._0_8_,(ulong)((long)(xmlNodePtr *)local_198._16_8_ + 1))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_168) {
          operator_delete(local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(long)local_168._vptr_Issue + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((((*(IssueImpl **)(local_b8._0_8_ + 8))->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,(ModelPtr *)node);
        Issue::IssueImpl::setReferenceRule
                  (*(IssueImpl **)(local_b8._0_8_ + 8),COMPONENT_REF_ELEMENT);
        Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)local_b8);
        p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
LAB_00243b87:
        if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
        }
      }
LAB_00243b94:
      XmlAttribute::next((XmlAttribute *)&local_158);
      uVar18 = local_98._8_8_;
      local_98._8_8_ = local_158._M_string_length;
      local_98._M_allocated_capacity = (size_type)local_158._M_dataplus._M_p;
      local_158._M_dataplus._M_p = (pointer)0x0;
      local_158._M_string_length = 0;
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18 !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
      }
      p_Var19 = p_Var17;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_98._M_allocated_capacity !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
    pNVar16 = (NameList *)
              (local_58->super_LoggerImpl).mErrors.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar9 = local_58;
    if (pNVar16 != (NameList *)0x0) {
      ComponentEntity::setEncapsulationId((ComponentEntity *)pNVar16,&local_88);
      local_5c = 0;
      goto LAB_00243dc8;
    }
  }
  local_5c = (undefined4)CONCAT71((int7)((ulong)pPVar9 >> 8),1);
  if (local_f8._M_string_length == 0) {
    Issue::IssueImpl::create();
    pIVar3 = (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    NamedEntity::name_abi_cxx11_
              (&local_1b8,
               (NamedEntity *)
               (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x2a64db);
    peVar12 = (element_type *)(plVar7 + 2);
    if ((element_type *)*plVar7 == peVar12) {
      local_198._16_8_ =
           (peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      puStack_180 = (pointer)plVar7[3];
      local_198._0_8_ = (element_type *)(local_198 + 0x10);
    }
    else {
      local_198._16_8_ =
           (peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_198._0_8_ = (element_type *)*plVar7;
    }
    local_198._8_8_ = plVar7[1];
    *plVar7 = (long)peVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_198);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar13) {
      local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_158.field_2._8_8_ = plVar7[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_158._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_158._M_string_length = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar3,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_,(ulong)((long)(xmlNodePtr *)local_198._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
              ((((local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,(ModelPtr *)node);
    Issue::IssueImpl::setReferenceRule
              ((local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,COMPONENT_REF_COMPONENT_ATTRIBUTE);
    Logger::LoggerImpl::addIssue((LoggerImpl *)model,&local_178);
    if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  pNVar16 = (NameList *)0x0;
LAB_00243dc8:
  XVar22 = XmlNode::firstChild((XmlNode *)local_c8);
  _Var15 = XVar22.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_allocated_capacity =
       local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((XmlNode *)local_c8._0_8_ != (XmlNode *)0x0) {
    local_50 = pNVar16;
    do {
      local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (*(char *)((long)&model[6].super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 1) == '\x01') {
        bVar5 = XmlNode::isCellml20Element((XmlNode *)local_c8._0_8_,"component_ref");
      }
      else {
        bVar5 = XmlNode::isCellml1XElement((XmlNode *)local_c8._0_8_,"component_ref");
      }
      if (bVar5 == false) {
        bVar5 = XmlNode::isText((XmlNode *)local_c8._0_8_);
        if (bVar5) {
          XmlNode::convertToString_abi_cxx11_((string *)local_198,(XmlNode *)local_c8._0_8_);
          bVar5 = hasNonWhitespaceCharacters((string *)local_198);
          if (bVar5) {
            Issue::IssueImpl::create();
            pIVar3 = (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            NamedEntity::name_abi_cxx11_
                      ((string *)local_b8,
                       (NamedEntity *)
                       (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
            plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x2a64db);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            puVar11 = (ulong *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_138.field_2._M_allocated_capacity = *puVar11;
              local_138.field_2._8_8_ = plVar7[3];
            }
            else {
              local_138.field_2._M_allocated_capacity = *puVar11;
              local_138._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_138._M_string_length = plVar7[1];
            *plVar7 = (long)puVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_138);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            psVar14 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_118.field_2._M_allocated_capacity = *psVar14;
              local_118.field_2._8_8_ = plVar7[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *psVar14;
              local_118._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_118._M_string_length = plVar7[1];
            *plVar7 = (long)psVar14;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_118,local_198._0_8_);
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &local_168;
            peVar10 = (element_type *)(plVar7 + 2);
            if ((element_type *)*plVar7 == peVar10) {
              local_168._vptr_Issue = peVar10->_vptr_Issue;
              local_168.mPimpl = (IssueImpl *)plVar7[3];
            }
            else {
              local_168._vptr_Issue = peVar10->_vptr_Issue;
              local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)*plVar7;
            }
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
            *plVar7 = (long)peVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            puVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1b8.field_2._M_allocated_capacity = *puVar11;
              local_1b8.field_2._8_8_ = puVar8[3];
            }
            else {
              local_1b8.field_2._M_allocated_capacity = *puVar11;
              local_1b8._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_1b8._M_string_length = puVar8[1];
            *puVar8 = puVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar3,&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_168) {
              operator_delete(local_178.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(long)local_168._vptr_Issue + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
              operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
            }
            AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                      ((((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,(ModelPtr *)node);
            Issue::IssueImpl::setReferenceRule
                      ((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,XML_UNEXPECTED_CHARACTER);
            Logger::LoggerImpl::addIssue((LoggerImpl *)model,&local_d8);
            if ((pointer)local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,
                            (ulong)((long)(xmlNodePtr *)local_198._16_8_ + 1));
          }
        }
        else {
          bVar5 = XmlNode::isComment((XmlNode *)local_c8._0_8_);
          if (!bVar5) {
            Issue::IssueImpl::create();
            pIVar3 = (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            NamedEntity::name_abi_cxx11_
                      (&local_138,
                       (NamedEntity *)
                       (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2a64db)
            ;
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            psVar14 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_118.field_2._M_allocated_capacity = *psVar14;
              local_118.field_2._8_8_ = plVar7[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *psVar14;
              local_118._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_118._M_string_length = plVar7[1];
            *plVar7 = (long)psVar14;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &local_168;
            peVar10 = (element_type *)(plVar7 + 2);
            if ((element_type *)*plVar7 == peVar10) {
              local_168._vptr_Issue = peVar10->_vptr_Issue;
              local_168.mPimpl = (IssueImpl *)plVar7[3];
            }
            else {
              local_168._vptr_Issue = peVar10->_vptr_Issue;
              local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)*plVar7;
            }
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
            *plVar7 = (long)peVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            XmlNode::name_abi_cxx11_((string *)local_b8,(XmlNode *)local_c8._0_8_);
            pp_Var20 = (_func_int **)0xf;
            if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_168) {
              pp_Var20 = local_168._vptr_Issue;
            }
            pp_Var2 = (_func_int **)
                      ((long)&(local_178.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base +
                      (long)(_func_int ***)local_b8._8_8_);
            if (pp_Var20 < pp_Var2) {
              pp_Var20 = (_func_int **)0xf;
              if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
                pp_Var20 = (_func_int **)local_b8._16_8_;
              }
              if (pp_Var20 < pp_Var2) goto LAB_00244126;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)local_b8,0,(char *)0x0,
                                  (ulong)local_178.
                                         super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            }
            else {
LAB_00244126:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_178,local_b8._0_8_);
            }
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            puVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1b8.field_2._M_allocated_capacity = *puVar11;
              local_1b8.field_2._8_8_ = puVar8[3];
            }
            else {
              local_1b8.field_2._M_allocated_capacity = *puVar11;
              local_1b8._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_1b8._M_string_length = puVar8[1];
            *puVar8 = puVar11;
            puVar8[1] = 0;
            *(undefined1 *)puVar11 = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
            local_198._0_8_ = local_198 + 0x10;
            peVar12 = (element_type *)(plVar7 + 2);
            if ((element_type *)*plVar7 == peVar12) {
              local_198._16_8_ =
                   (peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                   super_Entity._vptr_Entity;
              puStack_180 = (pointer)plVar7[3];
            }
            else {
              local_198._16_8_ =
                   (peVar12->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                   super_Entity._vptr_Entity;
              local_198._0_8_ = (element_type *)*plVar7;
            }
            local_198._8_8_ = plVar7[1];
            *plVar7 = (long)peVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar3,(string *)local_198);
            if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
              operator_delete((void *)local_198._0_8_,
                              (ulong)((long)(xmlNodePtr *)local_198._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
              operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
            }
            if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                &local_168) {
              operator_delete(local_178.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(long)local_168._vptr_Issue + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                      ((((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,(ModelPtr *)node);
            Issue::IssueImpl::setReferenceRule
                      ((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,COMPONENT_REF_CHILD);
            Logger::LoggerImpl::addIssue((LoggerImpl *)model,&local_d8);
            _Var15._M_pi = local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            goto LAB_00243e78;
          }
        }
      }
      else {
        loadComponentRef((ParserImpl *)local_198,model,node,(NameList *)local_c8);
        _Var15._M_pi = local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_198._0_8_;
        local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
LAB_00243e78:
        if ((pointer)_Var15._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
        }
      }
      if (local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        pNVar16 = local_50;
        if ((char)local_5c != '\0') {
          pNVar16 = (NameList *)
                    (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        }
        ComponentEntity::addComponent((ComponentEntity *)pNVar16,&local_48);
      }
      XVar22 = XmlNode::next((XmlNode *)local_198);
      uVar18 = local_c8._8_8_;
      local_c8._8_8_ = local_198._8_8_;
      local_c8._0_8_ = local_198._0_8_;
      _Var15 = XVar22.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      local_198._0_8_ = (element_type *)0x0;
      local_198._8_8_ = (pointer)0x0;
      if (((pointer)uVar18 != (pointer)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18),
         _Var15._M_pi = extraout_RDX, (pointer)local_198._8_8_ != (pointer)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        _Var15._M_pi = extraout_RDX_00;
      }
      if ((pointer)local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var15._M_pi = extraout_RDX_01;
      }
    } while ((XmlNode *)local_c8._0_8_ != (XmlNode *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      _Var15._M_pi = extraout_RDX_02;
    }
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    _Var15._M_pi = extraout_RDX_03;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    _Var15._M_pi = extraout_RDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
    _Var15._M_pi = extraout_RDX_05;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
    _Var15._M_pi = extraout_RDX_06;
  }
  CVar23.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var15._M_pi;
  CVar23.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58;
  return (ComponentPtr)CVar23.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr Parser::ParserImpl::loadComponentRef(const ModelPtr &model, const XmlNodePtr &node, NameList &usedNames)
{
    ComponentPtr parentComponent = nullptr;
    std::string parentComponentName;
    std::string encapsulationId;
    // Check for a component in the parent component_ref.
    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("component")) {
            parentComponentName = attribute->value();

            if (std::find(usedNames.begin(), usedNames.end(), parentComponentName) == usedNames.end()) {
                usedNames.emplace_back(parentComponentName);
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponentName + "' as a component in a component_ref but it is not unique.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE_UNIQUE);
                addIssue(issue);
            }

            if (model->containsComponent(parentComponentName)) {
                // Will re-add this to the model once we encapsulate the child(ren).
                parentComponent = model->takeComponent(parentComponentName);
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponentName + "' as a component in a component_ref but it does not exist in the model.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE_REFERENCE);
                addIssue(issue);
            }
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            encapsulationId = attribute->value();
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid component_ref attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_ELEMENT);
            addIssue(issue);
        }
        attribute = attribute->next();
    }
    if (!parentComponent && parentComponentName.empty()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' does not have a valid component attribute in a component_ref element.");
        issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE);
        addIssue(issue);
    } else if (parentComponent) {
        parentComponent->setEncapsulationId(encapsulationId);
    }

    // Get first child of this parent component_ref.
    XmlNodePtr childComponentNode = node->firstChild();

    // Loop over encapsulated children.
    std::string childEncapsulationId;
    while (childComponentNode) {
        ComponentPtr childComponent = nullptr;
        if (parseNode(childComponentNode, "component_ref")) {
            childComponent = loadComponentRef(model, childComponentNode, usedNames);
        } else if (childComponentNode->isText()) {
            const std::string textNode = childComponentNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childComponentNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid child element '" + childComponentNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_CHILD);
            addIssue(issue);
        }

        if (childComponent) {
            // Set parent/child encapsulation relationship.
            if (parentComponent) {
                parentComponent->addComponent(childComponent);
            } else {
                // Making sure that children which were taken from parents above, but have
                // invalid parents, are still included in the model.
                model->addComponent(childComponent);
            }
        }
        childComponentNode = childComponentNode->next();
    }

    return parentComponent;
}